

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O0

pos_type __thiscall
sai::ifstreambuf::seekoff(ifstreambuf *this,off_type Offset,seekdir Direction,openmode param_3)

{
  pos_type pVar1;
  long lVar2;
  long lVar3;
  fpos<__mbstate_t> local_70;
  fpos<__mbstate_t> local_60;
  fpos<__mbstate_t> local_50;
  undefined1 auStack_40 [8];
  pos_type Position;
  openmode param_3_local;
  seekdir Direction_local;
  off_type Offset_local;
  ifstreambuf *this_local;
  
  Position._M_state.__count = param_3;
  Position._M_state.__value = (anon_union_4_2_91654ee9_for___value)Direction;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_40);
  if (Position._M_state.__value.__wch == 0) {
    std::fpos<__mbstate_t>::fpos(&local_50,Offset);
    auStack_40 = (undefined1  [8])local_50._M_off;
    Position._M_off._0_4_ = local_50._M_state.__count;
    Position._M_off._4_4_ = local_50._M_state.__value;
  }
  else if (Position._M_state.__value.__wch == 1) {
    std::fpos<__mbstate_t>::fpos(&local_60,(ulong)this->CurrentPage << 0xc);
    auStack_40 = (undefined1  [8])local_60._M_off;
    Position._M_off._0_4_ = local_60._M_state.__count;
    Position._M_off._4_4_ = local_60._M_state.__value;
    lVar2 = std::streambuf::gptr();
    lVar3 = std::streambuf::egptr();
    std::fpos<__mbstate_t>::operator+=((fpos<__mbstate_t> *)auStack_40,lVar2 - lVar3);
    std::fpos<__mbstate_t>::operator+=((fpos<__mbstate_t> *)auStack_40,Offset);
  }
  else if (Position._M_state.__value.__wch == 2) {
    std::fpos<__mbstate_t>::fpos(&local_70,(ulong)this->PageCount * 0x1000 + Offset);
    auStack_40 = (undefined1  [8])local_70._M_off;
    Position._M_off._0_4_ = local_70._M_state.__count;
    Position._M_off._4_4_ = local_70._M_state.__value;
  }
  pVar1 = (pos_type)(**(code **)(*(long *)this + 0x28))(this,auStack_40,Position._M_off,8);
  return pVar1;
}

Assistant:

std::streambuf::pos_type ifstreambuf::seekoff(
	std::streambuf::off_type Offset, std::ios::seekdir Direction, std::ios::openmode /*Mode*/
)
{
	std::streambuf::pos_type Position;

	if( Direction == std::ios::beg )
	{
		Position = Offset;
	}
	else if( Direction == std::ios::cur )
	{
		Position = (CurrentPage * VirtualPage::PageSize); // Current Page
		Position += (gptr() - egptr());                   // Offset within page
		Position += Offset;
	}
	else if( Direction == std::ios::end )
	{
		Position = (PageCount * VirtualPage::PageSize) + Offset;
	}

	return seekpos(Position);
}